

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_fma.cpp
# Opt level: O3

int __thiscall
ncnn::LRN_x86_fma::forward_inplace(LRN_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  size_t _elemsize;
  bool bVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int *piVar10;
  undefined1 auVar11 [32];
  pointer piVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  _func_int ***ppp_Var16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  float *pfVar20;
  _func_int ***ppp_Var21;
  uint uVar22;
  int iVar23;
  void *pvVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  uint uVar29;
  undefined1 (*pauVar30) [32];
  long lVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  allocator_type local_1d1;
  Mat *local_1d0;
  undefined1 local_1c8 [12];
  float fStack_1bc;
  undefined4 local_1b8;
  undefined4 uStack_1b4;
  int local_1b0;
  Allocator *local_1a8;
  int iStack_1a0;
  float fStack_19c;
  int iStack_198;
  int iStack_194;
  int iStack_190;
  size_t local_188;
  ulong local_180;
  undefined8 local_178;
  ulong local_170;
  undefined1 local_168 [16];
  size_t local_158;
  int local_150;
  Allocator *local_148;
  int iStack_140;
  float fStack_13c;
  size_t sStack_138;
  int local_130;
  size_t local_128;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  long local_e8;
  Allocator *local_e0;
  long local_d8;
  void *local_d0;
  long local_c8;
  _func_int ***local_c0;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  vector<int,_std::allocator<int>_> _space_ofs;
  
  auVar2 = local_b8;
  local_118 = (float)bottom_top_blob->w;
  local_b8._4_4_ = 0;
  local_b8._0_4_ = bottom_top_blob->h;
  uVar29 = bottom_top_blob->c;
  uVar17 = (ulong)uVar29;
  _elemsize = bottom_top_blob->elemsize;
  local_128 = 0;
  local_168._0_8_ = (Allocator *)0x0;
  local_168._8_4_ = 0;
  local_168._12_4_ = 0.0;
  local_158 = SUB168(ZEXT816(0) << 0x40,4);
  local_150 = 0;
  fStack_114 = 0.0;
  local_b8._8_24_ = auVar2._8_24_;
  local_148 = (Allocator *)local_168._0_8_;
  iStack_140 = local_168._8_4_;
  fStack_13c = (float)local_168._12_4_;
  sStack_138 = local_158;
  local_130 = local_150;
  Mat::create((Mat *)local_168,(int)local_118,bottom_top_blob->h,uVar29,_elemsize,
              opt->workspace_allocator);
  iVar25 = -100;
  if (((Allocator *)local_168._0_8_ == (Allocator *)0x0) || ((long)local_130 * local_128 == 0))
  goto LAB_0031745e;
  uVar22 = local_b8._0_4_ * (int)local_118;
  if (0 < (int)uVar29) {
    uVar15 = 0;
    do {
      pfVar20 = (float *)(bottom_top_blob->cstep * uVar15 * bottom_top_blob->elemsize +
                         (long)bottom_top_blob->data);
      ppp_Var16 = (_func_int ***)
                  ((long)(_func_int ***)local_168._0_8_ + local_128 * uVar15 * local_158);
      if ((int)uVar22 < 8) {
        uVar18 = 0;
      }
      else {
        iVar25 = 7;
        do {
          auVar2._4_4_ = pfVar20[1] * pfVar20[1];
          auVar2._0_4_ = *pfVar20 * *pfVar20;
          auVar2._8_4_ = pfVar20[2] * pfVar20[2];
          auVar2._12_4_ = pfVar20[3] * pfVar20[3];
          auVar2._16_4_ = pfVar20[4] * pfVar20[4];
          auVar2._20_4_ = pfVar20[5] * pfVar20[5];
          auVar2._24_4_ = pfVar20[6] * pfVar20[6];
          auVar2._28_4_ = pfVar20[7];
          *(undefined1 (*) [32])ppp_Var16 = auVar2;
          pfVar20 = pfVar20 + 8;
          ppp_Var16 = ppp_Var16 + 4;
          iVar25 = iVar25 + 8;
          uVar18 = uVar22 & 0xfffffff8;
        } while (iVar25 < (int)uVar22);
      }
      if (uVar22 - uVar18 != 0 && (int)uVar18 <= (int)uVar22) {
        lVar28 = 0;
        do {
          *(float *)((long)ppp_Var16 + lVar28 * 4) = pfVar20[lVar28] * pfVar20[lVar28];
          lVar28 = lVar28 + 1;
        } while (uVar22 - uVar18 != (int)lVar28);
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != uVar17);
  }
  iVar25 = (this->super_LRN).region_type;
  local_170 = uVar17;
  if (iVar25 == 0) {
    local_188 = 0;
    local_1c8._0_8_ = (Allocator *)0x0;
    local_1c8._8_4_ = 0;
    fStack_1bc = 0.0;
    local_1b8 = 0;
    uStack_1b4 = 0;
    local_1b0 = 0;
    local_1a8 = (Allocator *)0x0;
    iStack_1a0 = 0;
    fStack_19c = 0.0;
    iStack_198 = 0;
    iStack_194 = 0;
    iStack_190 = 0;
    Mat::create((Mat *)local_1c8,(int)local_118,local_b8._0_4_,uVar29,_elemsize,
                opt->workspace_allocator);
    if (((Allocator *)local_1c8._0_8_ == (Allocator *)0x0) || (local_188 * (long)iStack_190 == 0)) {
      piVar10 = (int *)CONCAT44(fStack_1bc,local_1c8._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1a8 == (Allocator *)0x0) {
joined_r0x00317436:
            if ((Allocator *)local_1c8._0_8_ != (Allocator *)0x0) {
              free((void *)local_1c8._0_8_);
            }
          }
          else {
            (*local_1a8->_vptr_Allocator[3])();
          }
        }
      }
LAB_00317459:
      iVar25 = -100;
      goto LAB_0031745e;
    }
    uVar18 = (int)local_188 * iStack_190;
    if (0 < (int)uVar18) {
      memset((void *)local_1c8._0_8_,0,(ulong)uVar18 << 2);
    }
    if (0 < (int)uVar29) {
      local_f8._0_4_ = (this->super_LRN).alpha / (float)(this->super_LRN).local_size;
      local_f8._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar36 = vshufps_avx(local_f8,local_f8,0);
      local_b8._16_16_ = auVar36;
      local_b8._0_16_ = auVar36;
      uVar15 = 0;
      local_178 = CONCAT44(local_178._4_4_,uVar22) & 0xfffffffffffffff8;
      uVar29 = uVar22 & 0xfffffff8;
      local_1d0 = bottom_top_blob;
      do {
        auVar66._8_4_ = 0x3f000000;
        auVar66._0_8_ = 0x3f0000003f000000;
        auVar63._8_4_ = 0x807fffff;
        auVar63._0_8_ = 0x807fffff807fffff;
        auVar44._8_4_ = 0x800000;
        auVar44._0_8_ = 0x80000000800000;
        auVar66._12_4_ = 0x3f000000;
        auVar63._12_4_ = 0x807fffff;
        auVar44._12_4_ = 0x800000;
        auVar66._16_4_ = 0x3f000000;
        auVar63._16_4_ = 0x807fffff;
        auVar44._16_4_ = 0x800000;
        auVar66._20_4_ = 0x3f000000;
        auVar63._20_4_ = 0x807fffff;
        auVar44._20_4_ = 0x800000;
        auVar66._24_4_ = 0x3f000000;
        auVar63._24_4_ = 0x807fffff;
        auVar44._24_4_ = 0x800000;
        auVar66._28_4_ = 0x3f000000;
        auVar63._28_4_ = 0x807fffff;
        auVar44._28_4_ = 0x800000;
        iVar25 = (this->super_LRN).local_size / 2;
        iVar13 = (int)uVar15;
        uVar18 = iVar13 - iVar25;
        if ((int)uVar18 <= iVar25 + iVar13) {
          do {
            if (uVar18 < (uint)uVar17) {
              ppp_Var16 = (_func_int ***)
                          ((long)(_func_int ***)local_168._0_8_ + uVar18 * local_128 * local_158);
              ppp_Var21 = (_func_int ***)
                          ((long)(_func_int ***)local_1c8._0_8_ +
                          local_188 * uVar15 * CONCAT44(uStack_1b4,local_1b8));
              uVar26 = 0;
              if (7 < (int)uVar22) {
                iVar25 = 7;
                do {
                  auVar33._0_4_ = *(float *)ppp_Var21 + *(float *)ppp_Var16;
                  auVar33._4_4_ = *(float *)((long)ppp_Var21 + 4) + *(float *)((long)ppp_Var16 + 4);
                  auVar33._8_4_ = *(float *)(ppp_Var21 + 1) + *(float *)(ppp_Var16 + 1);
                  auVar33._12_4_ =
                       *(float *)((long)(ppp_Var21 + 1) + 4) + *(float *)((long)(ppp_Var16 + 1) + 4)
                  ;
                  auVar33._16_4_ = *(float *)(ppp_Var21 + 2) + *(float *)(ppp_Var16 + 2);
                  auVar33._20_4_ =
                       *(float *)((long)(ppp_Var21 + 2) + 4) + *(float *)((long)(ppp_Var16 + 2) + 4)
                  ;
                  auVar33._24_4_ = *(float *)(ppp_Var21 + 3) + *(float *)(ppp_Var16 + 3);
                  auVar33._28_4_ =
                       *(float *)((long)(ppp_Var21 + 3) + 4) + *(float *)((long)(ppp_Var16 + 3) + 4)
                  ;
                  *(undefined1 (*) [32])ppp_Var21 = auVar33;
                  ppp_Var16 = ppp_Var16 + 4;
                  ppp_Var21 = ppp_Var21 + 4;
                  iVar25 = iVar25 + 8;
                  uVar26 = uVar29;
                } while (iVar25 < (int)uVar22);
              }
              if (uVar22 - uVar26 != 0 && (int)uVar26 <= (int)uVar22) {
                lVar28 = 0;
                do {
                  *(float *)((long)ppp_Var21 + lVar28 * 4) =
                       *(float *)((long)ppp_Var21 + lVar28 * 4) +
                       *(float *)((long)ppp_Var16 + lVar28 * 4);
                  lVar28 = lVar28 + 1;
                } while (uVar22 - uVar26 != (int)lVar28);
              }
            }
            bVar1 = (int)uVar18 < (this->super_LRN).local_size / 2 + iVar13;
            uVar18 = uVar18 + 1;
          } while (bVar1);
        }
        pauVar30 = (undefined1 (*) [32])
                   (local_1d0->cstep * uVar15 * local_1d0->elemsize + (long)local_1d0->data);
        ppp_Var16 = (_func_int ***)
                    ((long)(_func_int ***)local_1c8._0_8_ +
                    local_188 * uVar15 * CONCAT44(uStack_1b4,local_1b8));
        uVar18 = 0;
        if (7 < (int)uVar22) {
          local_118 = (this->super_LRN).bias;
          fVar32 = (this->super_LRN).beta;
          auVar36._0_8_ = CONCAT44(fVar32,fVar32) ^ 0x8000000080000000;
          auVar36._8_4_ = -fVar32;
          auVar36._12_4_ = -fVar32;
          auVar34._16_16_ = auVar36;
          auVar34._0_16_ = auVar36;
          iVar25 = 7;
          auVar35._8_4_ = 0xb95e8083;
          auVar35._0_8_ = 0xb95e8083b95e8083;
          auVar35._12_4_ = 0xb95e8083;
          auVar35._16_4_ = 0xb95e8083;
          auVar35._20_4_ = 0xb95e8083;
          auVar35._24_4_ = 0xb95e8083;
          auVar35._28_4_ = 0xb95e8083;
          auVar37._8_4_ = 0x3f318000;
          auVar37._0_8_ = 0x3f3180003f318000;
          auVar37._12_4_ = 0x3f318000;
          auVar37._16_4_ = 0x3f318000;
          auVar37._20_4_ = 0x3f318000;
          auVar37._24_4_ = 0x3f318000;
          auVar37._28_4_ = 0x3f318000;
          auVar64._8_4_ = 0xffffff81;
          auVar64._0_8_ = 0xffffff81ffffff81;
          auVar64._12_4_ = 0xffffff81;
          auVar65._8_4_ = 0x3f800000;
          auVar65._0_8_ = 0x3f8000003f800000;
          auVar65._12_4_ = 0x3f800000;
          do {
            auVar11._4_4_ = local_118;
            auVar11._0_4_ = local_118;
            auVar11._8_4_ = local_118;
            auVar11._12_4_ = local_118;
            auVar11._16_4_ = local_118;
            auVar11._20_4_ = local_118;
            auVar11._24_4_ = local_118;
            auVar11._28_4_ = local_118;
            auVar5 = vfmadd213ps_fma(*(undefined1 (*) [32])ppp_Var16,local_b8,auVar11);
            auVar3 = vmaxps_avx(ZEXT1632(auVar5),auVar44);
            auVar43 = vpsrld_avx(auVar3._0_16_,0x17);
            auVar2 = vandps_avx(auVar63,auVar3);
            auVar4 = vorps_avx(auVar66,auVar2);
            auVar50._8_4_ = 0x3f3504f3;
            auVar50._0_8_ = 0x3f3504f33f3504f3;
            auVar50._12_4_ = 0x3f3504f3;
            auVar50._16_4_ = 0x3f3504f3;
            auVar50._20_4_ = 0x3f3504f3;
            auVar50._24_4_ = 0x3f3504f3;
            auVar50._28_4_ = 0x3f3504f3;
            auVar33 = vcmpps_avx(auVar50,auVar4,2);
            auVar2 = vandnps_avx(auVar33,auVar4);
            auVar59 = vpsrld_avx(auVar3._16_16_,0x17);
            auVar39._0_4_ = auVar4._0_4_ + -1.0 + auVar2._0_4_;
            auVar39._4_4_ = auVar4._4_4_ + -1.0 + auVar2._4_4_;
            auVar39._8_4_ = auVar4._8_4_ + -1.0 + auVar2._8_4_;
            auVar39._12_4_ = auVar4._12_4_ + -1.0 + auVar2._12_4_;
            auVar39._16_4_ = auVar4._16_4_ + -1.0 + auVar2._16_4_;
            auVar39._20_4_ = auVar4._20_4_ + -1.0 + auVar2._20_4_;
            auVar39._24_4_ = auVar4._24_4_ + -1.0 + auVar2._24_4_;
            auVar39._28_4_ = auVar4._28_4_ + -1.0 + auVar2._28_4_;
            auVar43 = vpsubd_avx(auVar43,auVar33._0_16_);
            auVar59 = vpsubd_avx(auVar59,auVar33._16_16_);
            auVar43 = vpaddd_avx(auVar64,auVar43);
            auVar51._8_4_ = 0x3d9021bb;
            auVar51._0_8_ = 0x3d9021bb3d9021bb;
            auVar51._12_4_ = 0x3d9021bb;
            auVar51._16_4_ = 0x3d9021bb;
            auVar51._20_4_ = 0x3d9021bb;
            auVar51._24_4_ = 0x3d9021bb;
            auVar51._28_4_ = 0x3d9021bb;
            auVar55._8_4_ = 0xbdebd1b8;
            auVar55._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar55._12_4_ = 0xbdebd1b8;
            auVar55._16_4_ = 0xbdebd1b8;
            auVar55._20_4_ = 0xbdebd1b8;
            auVar55._24_4_ = 0xbdebd1b8;
            auVar55._28_4_ = 0xbdebd1b8;
            auVar6 = vfmadd213ps_fma(auVar51,auVar39,auVar55);
            auVar59 = vpaddd_avx(auVar64,auVar59);
            auVar56._8_4_ = 0x3def251a;
            auVar56._0_8_ = 0x3def251a3def251a;
            auVar56._12_4_ = 0x3def251a;
            auVar56._16_4_ = 0x3def251a;
            auVar56._20_4_ = 0x3def251a;
            auVar56._24_4_ = 0x3def251a;
            auVar56._28_4_ = 0x3def251a;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar56);
            auVar57._8_4_ = 0xbdfe5d4f;
            auVar57._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar57._12_4_ = 0xbdfe5d4f;
            auVar57._16_4_ = 0xbdfe5d4f;
            auVar57._20_4_ = 0xbdfe5d4f;
            auVar57._24_4_ = 0xbdfe5d4f;
            auVar57._28_4_ = 0xbdfe5d4f;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar57);
            auVar58._8_4_ = 0x3e11e9bf;
            auVar58._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar58._12_4_ = 0x3e11e9bf;
            auVar58._16_4_ = 0x3e11e9bf;
            auVar58._20_4_ = 0x3e11e9bf;
            auVar58._24_4_ = 0x3e11e9bf;
            auVar58._28_4_ = 0x3e11e9bf;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar58);
            auVar3._4_4_ = auVar39._4_4_ * auVar39._4_4_;
            auVar3._0_4_ = auVar39._0_4_ * auVar39._0_4_;
            auVar3._8_4_ = auVar39._8_4_ * auVar39._8_4_;
            auVar3._12_4_ = auVar39._12_4_ * auVar39._12_4_;
            auVar3._16_4_ = auVar39._16_4_ * auVar39._16_4_;
            auVar3._20_4_ = auVar39._20_4_ * auVar39._20_4_;
            auVar3._24_4_ = auVar39._24_4_ * auVar39._24_4_;
            auVar3._28_4_ = 0x3e11e9bf;
            auVar60._8_4_ = 0xbe2aae50;
            auVar60._0_8_ = 0xbe2aae50be2aae50;
            auVar60._12_4_ = 0xbe2aae50;
            auVar60._16_4_ = 0xbe2aae50;
            auVar60._20_4_ = 0xbe2aae50;
            auVar60._24_4_ = 0xbe2aae50;
            auVar60._28_4_ = 0xbe2aae50;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar60);
            auVar61._8_4_ = 0x3e4cceac;
            auVar61._0_8_ = 0x3e4cceac3e4cceac;
            auVar61._12_4_ = 0x3e4cceac;
            auVar61._16_4_ = 0x3e4cceac;
            auVar61._20_4_ = 0x3e4cceac;
            auVar61._24_4_ = 0x3e4cceac;
            auVar61._28_4_ = 0x3e4cceac;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar61);
            auVar62._8_4_ = 0xbe7ffffc;
            auVar62._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar62._12_4_ = 0xbe7ffffc;
            auVar62._16_4_ = 0xbe7ffffc;
            auVar62._20_4_ = 0xbe7ffffc;
            auVar62._24_4_ = 0xbe7ffffc;
            auVar62._28_4_ = 0xbe7ffffc;
            auVar6 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar62);
            auVar45._16_16_ = auVar59;
            auVar45._0_16_ = auVar43;
            auVar47._8_4_ = 0x3eaaaaaa;
            auVar47._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar47._12_4_ = 0x3eaaaaaa;
            auVar47._16_4_ = 0x3eaaaaaa;
            auVar47._20_4_ = 0x3eaaaaaa;
            auVar47._24_4_ = 0x3eaaaaaa;
            auVar47._28_4_ = 0x3eaaaaaa;
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar39,auVar47);
            auVar4._4_4_ = auVar39._4_4_ * auVar39._4_4_ * auVar39._4_4_ * auVar43._4_4_;
            auVar4._0_4_ = auVar39._0_4_ * auVar39._0_4_ * auVar39._0_4_ * auVar43._0_4_;
            auVar4._8_4_ = auVar39._8_4_ * auVar39._8_4_ * auVar39._8_4_ * auVar43._8_4_;
            auVar4._12_4_ = auVar39._12_4_ * auVar39._12_4_ * auVar39._12_4_ * auVar43._12_4_;
            auVar4._16_4_ = auVar39._16_4_ * auVar39._16_4_ * auVar39._16_4_ * 0.0;
            auVar4._20_4_ = auVar39._20_4_ * auVar39._20_4_ * auVar39._20_4_ * 0.0;
            auVar4._24_4_ = auVar39._24_4_ * auVar39._24_4_ * auVar39._24_4_ * 0.0;
            auVar4._28_4_ = 0x3eaaaaaa;
            auVar33 = vcvtdq2ps_avx(auVar45);
            auVar43 = vfmadd231ps_fma(auVar4,auVar33,auVar35);
            auVar43 = vfmsub231ps_fma(ZEXT1632(auVar43),auVar66,auVar3);
            auVar3 = vsubps_avx(ZEXT1632(auVar43),auVar39);
            auVar2 = vcmpps_avx(ZEXT1632(auVar5),ZEXT832(0) << 0x20,2);
            auVar43 = vfmsub231ps_fma(auVar3,auVar37,auVar33);
            auVar2 = vorps_avx(auVar2,ZEXT1632(auVar43));
            local_98._0_4_ = (undefined4)auVar36._0_8_;
            local_98._4_4_ = (undefined4)(auVar36._0_8_ >> 0x20);
            auVar7._4_4_ = auVar2._4_4_ * (float)local_98._4_4_;
            auVar7._0_4_ = auVar2._0_4_ * (float)local_98._0_4_;
            auVar7._8_4_ = auVar2._8_4_ * auVar36._8_4_;
            auVar7._12_4_ = auVar2._12_4_ * auVar36._12_4_;
            auVar7._16_4_ = auVar2._16_4_ * (float)local_98._0_4_;
            auVar7._20_4_ = auVar2._20_4_ * (float)local_98._4_4_;
            auVar7._24_4_ = auVar2._24_4_ * auVar36._8_4_;
            auVar7._28_4_ = auVar2._28_4_;
            auVar40._8_4_ = 0x42b0c0a5;
            auVar40._0_8_ = 0x42b0c0a542b0c0a5;
            auVar40._12_4_ = 0x42b0c0a5;
            auVar40._16_4_ = 0x42b0c0a5;
            auVar40._20_4_ = 0x42b0c0a5;
            auVar40._24_4_ = 0x42b0c0a5;
            auVar40._28_4_ = 0x42b0c0a5;
            auVar2 = vminps_avx(auVar7,auVar40);
            auVar41._8_4_ = 0xc2b0c0a5;
            auVar41._0_8_ = 0xc2b0c0a5c2b0c0a5;
            auVar41._12_4_ = 0xc2b0c0a5;
            auVar41._16_4_ = 0xc2b0c0a5;
            auVar41._20_4_ = 0xc2b0c0a5;
            auVar41._24_4_ = 0xc2b0c0a5;
            auVar41._28_4_ = 0xc2b0c0a5;
            auVar33 = vmaxps_avx(auVar2,auVar41);
            auVar42._8_4_ = 0x3fb8aa3b;
            auVar42._0_8_ = 0x3fb8aa3b3fb8aa3b;
            auVar42._12_4_ = 0x3fb8aa3b;
            auVar42._16_4_ = 0x3fb8aa3b;
            auVar42._20_4_ = 0x3fb8aa3b;
            auVar42._24_4_ = 0x3fb8aa3b;
            auVar42._28_4_ = 0x3fb8aa3b;
            auVar43 = vfmadd213ps_fma(auVar42,auVar33,auVar66);
            auVar3 = vroundps_avx(ZEXT1632(auVar43),1);
            auVar2 = vcmpps_avx(ZEXT1632(auVar43),auVar3,1);
            auVar48._8_4_ = 0x3f800000;
            auVar48._0_8_ = 0x3f8000003f800000;
            auVar48._12_4_ = 0x3f800000;
            auVar48._16_4_ = 0x3f800000;
            auVar48._20_4_ = 0x3f800000;
            auVar48._24_4_ = 0x3f800000;
            auVar48._28_4_ = 0x3f800000;
            auVar2 = vandps_avx(auVar2,auVar48);
            auVar2 = vsubps_avx(auVar3,auVar2);
            auVar43 = vfmsub231ps_fma(auVar33,auVar2,auVar37);
            auVar59 = vfnmsub231ps_fma(ZEXT1632(auVar43),auVar2,auVar35);
            auVar46._8_4_ = 0x39506967;
            auVar46._0_8_ = 0x3950696739506967;
            auVar46._12_4_ = 0x39506967;
            auVar46._16_4_ = 0x39506967;
            auVar46._20_4_ = 0x39506967;
            auVar46._24_4_ = 0x39506967;
            auVar46._28_4_ = 0x39506967;
            auVar49._8_4_ = 0x3ab743ce;
            auVar49._0_8_ = 0x3ab743ce3ab743ce;
            auVar49._12_4_ = 0x3ab743ce;
            auVar49._16_4_ = 0x3ab743ce;
            auVar49._20_4_ = 0x3ab743ce;
            auVar49._24_4_ = 0x3ab743ce;
            auVar49._28_4_ = 0x3ab743ce;
            auVar43 = vfmadd213ps_fma(auVar46,ZEXT1632(auVar59),auVar49);
            auVar8._28_4_ = 0x3ab743ce;
            auVar8._0_28_ =
                 ZEXT1628(CONCAT412(auVar59._12_4_ * auVar59._12_4_,
                                    CONCAT48(auVar59._8_4_ * auVar59._8_4_,
                                             CONCAT44(auVar59._4_4_ * auVar59._4_4_,
                                                      auVar59._0_4_ * auVar59._0_4_))));
            auVar52._8_4_ = 0x3c088908;
            auVar52._0_8_ = 0x3c0889083c088908;
            auVar52._12_4_ = 0x3c088908;
            auVar52._16_4_ = 0x3c088908;
            auVar52._20_4_ = 0x3c088908;
            auVar52._24_4_ = 0x3c088908;
            auVar52._28_4_ = 0x3c088908;
            auVar33 = ZEXT1632(auVar59);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar33,auVar52);
            auVar53._8_4_ = 0x3d2aa9c1;
            auVar53._0_8_ = 0x3d2aa9c13d2aa9c1;
            auVar53._12_4_ = 0x3d2aa9c1;
            auVar53._16_4_ = 0x3d2aa9c1;
            auVar53._20_4_ = 0x3d2aa9c1;
            auVar53._24_4_ = 0x3d2aa9c1;
            auVar53._28_4_ = 0x3d2aa9c1;
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar33,auVar53);
            auVar54._8_4_ = 0x3e2aaaaa;
            auVar54._0_8_ = 0x3e2aaaaa3e2aaaaa;
            auVar54._12_4_ = 0x3e2aaaaa;
            auVar54._16_4_ = 0x3e2aaaaa;
            auVar54._20_4_ = 0x3e2aaaaa;
            auVar54._24_4_ = 0x3e2aaaaa;
            auVar54._28_4_ = 0x3e2aaaaa;
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar33,auVar54);
            auVar43 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar33,auVar66);
            auVar5 = vfmadd213ps_fma(ZEXT1632(auVar43),auVar8,auVar33);
            auVar43._0_4_ = (int)auVar2._0_4_;
            auVar43._4_4_ = (int)auVar2._4_4_;
            auVar43._8_4_ = (int)auVar2._8_4_;
            auVar43._12_4_ = (int)auVar2._12_4_;
            auVar38._16_4_ = (int)auVar2._16_4_;
            auVar38._0_16_ = auVar43;
            auVar38._20_4_ = (int)auVar2._20_4_;
            auVar38._24_4_ = (int)auVar2._24_4_;
            auVar38._28_4_ = (int)auVar2._28_4_;
            auVar59 = vpslld_avx(auVar43,0x17);
            auVar43 = vpslld_avx(auVar38._16_16_,0x17);
            auVar43 = vpaddd_avx(auVar65,auVar43);
            auVar59 = vpaddd_avx(auVar65,auVar59);
            auVar9._4_4_ = auVar59._4_4_ * *(float *)((long)*pauVar30 + 4);
            auVar9._0_4_ = auVar59._0_4_ * *(float *)*pauVar30;
            auVar9._8_4_ = auVar59._8_4_ * *(float *)((long)*pauVar30 + 8);
            auVar9._12_4_ = auVar59._12_4_ * *(float *)((long)*pauVar30 + 0xc);
            auVar9._16_4_ = auVar43._0_4_ * *(float *)((long)*pauVar30 + 0x10);
            auVar9._20_4_ = auVar43._4_4_ * *(float *)((long)*pauVar30 + 0x14);
            auVar9._24_4_ = auVar43._8_4_ * *(float *)((long)*pauVar30 + 0x18);
            auVar9._28_4_ = auVar43._12_4_;
            auVar43 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar5),auVar9);
            *pauVar30 = ZEXT1632(auVar43);
            ppp_Var16 = ppp_Var16 + 4;
            pauVar30 = pauVar30 + 1;
            iVar25 = iVar25 + 8;
            uVar18 = uVar29;
            fStack_114 = local_118;
            fStack_110 = local_118;
            fStack_10c = local_118;
            fStack_108 = local_118;
            fStack_104 = local_118;
            fStack_100 = local_118;
            fStack_fc = local_118;
            local_98 = auVar34;
          } while (iVar25 < (int)uVar22);
        }
        if (uVar22 - uVar18 != 0 && (int)uVar18 <= (int)uVar22) {
          lVar28 = 0;
          do {
            auVar36 = vfmadd213ss_fma(ZEXT416(*(uint *)((long)ppp_Var16 + lVar28 * 4)),local_f8,
                                      ZEXT416((uint)(this->super_LRN).bias));
            fVar32 = powf(auVar36._0_4_,-(this->super_LRN).beta);
            *(float *)((long)*pauVar30 + lVar28 * 4) =
                 fVar32 * *(float *)((long)*pauVar30 + lVar28 * 4);
            lVar28 = lVar28 + 1;
          } while (uVar22 - uVar18 != (int)lVar28);
        }
        uVar15 = uVar15 + 1;
        uVar17 = local_170;
        uVar29 = (uint)local_178;
      } while (uVar15 != local_170);
    }
    piVar10 = (int *)CONCAT44(fStack_1bc,local_1c8._8_4_);
    iVar25 = 0;
    if (piVar10 == (int *)0x0) goto LAB_0031745e;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_0031745e;
    if (local_1a8 != (Allocator *)0x0) {
      (*local_1a8->_vptr_Allocator[3])();
      goto LAB_0031745e;
    }
  }
  else {
    if (iVar25 != 1) {
      iVar25 = 0;
      goto LAB_0031745e;
    }
    piVar10 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
    local_1c8._0_8_ = local_168._0_8_;
    local_1c8._8_4_ = local_168._8_4_;
    fStack_1bc = (float)local_168._12_4_;
    local_1b8 = (undefined4)local_158;
    uStack_1b4 = (undefined4)(local_158 >> 0x20);
    local_1b0 = local_150;
    local_1a8 = local_148;
    iStack_1a0 = iStack_140;
    fStack_19c = fStack_13c;
    iStack_198 = (int)sStack_138;
    iStack_194 = (int)(sStack_138 >> 0x20);
    iStack_190 = local_130;
    local_188 = local_128;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + 1;
      UNLOCK();
    }
    uVar22 = (this->super_LRN).local_size;
    fVar32 = local_118;
    if (1 < (int)uVar22) {
      uVar18 = uVar22 >> 1;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = *(pointer *)opt;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)opt->workspace_allocator;
      _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)opt->workspace_allocator;
      copy_make_border((Mat *)local_168,(Mat *)local_1c8,uVar18,~uVar18 + uVar22,uVar18,
                       ~uVar18 + uVar22,0,0.0,(Option *)&_space_ofs);
      if (((Allocator *)local_1c8._0_8_ == (Allocator *)0x0) || ((long)iStack_190 * local_188 == 0))
      {
        piVar10 = (int *)CONCAT44(fStack_1bc,local_1c8._8_4_);
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if (*piVar10 == 0) {
            if (local_1a8 == (Allocator *)0x0) goto joined_r0x00317436;
            (*local_1a8->_vptr_Allocator[3])();
          }
        }
        goto LAB_00317459;
      }
      uVar22 = (this->super_LRN).local_size;
      fVar32 = fStack_19c;
    }
    uVar18 = uVar22 * uVar22;
    local_98._0_4_ = (this->super_LRN).alpha;
    std::vector<int,_std::allocator<int>_>::vector(&_space_ofs,(ulong)uVar18,&local_1d1);
    piVar12 = _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    iVar25 = (this->super_LRN).local_size;
    if (0 < iVar25) {
      iVar23 = (int)fVar32 - iVar25;
      iVar13 = 0;
      iVar14 = 0;
      iVar19 = 0;
      do {
        if (0 < iVar25) {
          lVar28 = 0;
          do {
            _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
            ._M_start[iVar19 + lVar28] = iVar14 + (int)lVar28;
            iVar25 = (this->super_LRN).local_size;
            lVar28 = lVar28 + 1;
            iVar27 = (int)lVar28;
          } while (iVar27 < iVar25);
          iVar19 = iVar19 + iVar27;
          iVar14 = iVar14 + iVar27;
        }
        iVar14 = iVar14 + iVar23;
        iVar13 = iVar13 + 1;
      } while (iVar13 < iVar25);
    }
    if (0 < (int)uVar29) {
      local_178 = (ulong)(int)local_118;
      local_d0 = bottom_top_blob->data;
      local_d8 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
      local_e0 = (Allocator *)local_1c8._0_8_;
      local_e8 = local_188 * CONCAT44(uStack_1b4,local_1b8);
      local_c8 = (long)(int)fStack_19c * CONCAT44(uStack_1b4,local_1b8);
      local_f8._0_4_ = 1.0 / (float)(int)uVar18;
      local_180 = 0;
      do {
        if (0 < (int)local_b8._0_4_) {
          local_c0 = (_func_int ***)((long)&local_e0->_vptr_Allocator + local_e8 * local_180);
          pvVar24 = (void *)(local_d8 * local_180 + (long)local_d0);
          local_1d0 = (Mat *)0x0;
          do {
            ppp_Var16 = local_c0;
            if (0 < (int)local_118) {
              lVar31 = local_c8 * (long)local_1d0;
              lVar28 = 0;
              do {
                if (uVar22 == 0) {
                  fVar32 = 0.0;
                }
                else {
                  fVar32 = 0.0;
                  uVar17 = 0;
                  do {
                    fVar32 = fVar32 + *(float *)((long)ppp_Var16 +
                                                (long)piVar12[uVar17] * 4 + lVar28 * 4 + lVar31);
                    uVar17 = uVar17 + 1;
                  } while (uVar18 + (uVar18 == 0) != uVar17);
                }
                auVar36 = vfmadd213ss_fma(ZEXT416((uint)(fVar32 * (float)local_98._0_4_)),
                                          ZEXT416((uint)local_f8._0_4_),
                                          ZEXT416((uint)(this->super_LRN).bias));
                fVar32 = powf(auVar36._0_4_,-(this->super_LRN).beta);
                *(float *)((long)pvVar24 + lVar28 * 4) =
                     fVar32 * *(float *)((long)pvVar24 + lVar28 * 4);
                lVar28 = lVar28 + 1;
              } while (lVar28 != CONCAT44(fStack_114,local_118));
            }
            pvVar24 = (void *)((long)pvVar24 + local_178 * 4);
            local_1d0 = (Mat *)((long)&local_1d0->data + 1);
          } while (local_1d0 != (Mat *)local_b8._0_8_);
        }
        local_180 = local_180 + 1;
      } while (local_180 != local_170);
    }
    if (piVar12 != (pointer)0x0) {
      operator_delete(piVar12,(long)_space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                    .super__Vector_impl_data._M_end_of_storage - (long)piVar12);
    }
    piVar10 = (int *)CONCAT44(fStack_1bc,local_1c8._8_4_);
    iVar25 = 0;
    if (piVar10 == (int *)0x0) goto LAB_0031745e;
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 != 0) goto LAB_0031745e;
    if (local_1a8 != (Allocator *)0x0) {
      (*local_1a8->_vptr_Allocator[3])();
      goto LAB_0031745e;
    }
  }
  iVar25 = 0;
  if ((Allocator *)local_1c8._0_8_ != (Allocator *)0x0) {
    iVar25 = 0;
    free((void *)local_1c8._0_8_);
  }
LAB_0031745e:
  piVar10 = (int *)CONCAT44(local_168._12_4_,local_168._8_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_148 == (Allocator *)0x0) {
        if ((Allocator *)local_168._0_8_ != (Allocator *)0x0) {
          free((void *)local_168._0_8_);
        }
      }
      else {
        (*local_148->_vptr_Allocator[3])();
      }
    }
  }
  return iVar25;
}

Assistant:

int LRN_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}